

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

size_t __thiscall Assimp::FBX::FBXExportProperty::size(FBXExportProperty *this)

{
  uint uVar1;
  DeadlyImportError *this_00;
  long lStack_50;
  allocator<char> local_39;
  string local_38;
  ulong uVar2;
  
  uVar1 = (byte)this->type - 0x43;
  uVar2 = (ulong)uVar1;
  if (uVar1 < 0x27) {
    if ((0x40024bUL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x18000UL >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x4200000000U >> (uVar2 & 0x3f) & 1) == 0) goto LAB_0034cec5;
        lStack_50 = 0xd;
      }
      else {
        lStack_50 = 5;
      }
    }
    else {
      lStack_50 = 1;
    }
    return (size_t)((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (lStack_50 -
                   (long)(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start));
  }
LAB_0034cec5:
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Requested size on property of unknown type",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t FBXExportProperty::size() {
    switch (type) {
        case 'C':
        case 'Y':
        case 'I':
        case 'F':
        case 'D':
        case 'L':
            return data.size() + 1;
        case 'S':
        case 'R':
            return data.size() + 5;
        case 'i':
        case 'd':
            return data.size() + 13;
        default:
            throw DeadlyExportError("Requested size on property of unknown type");
    }
}